

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * convertLatin1toUTF8(char *source)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  size_t __nmemb;
  char cVar5;
  char *s;
  
  cVar5 = *source;
  if (cVar5 != '\0') {
    pcVar1 = source + 1;
    __nmemb = 1;
    cVar3 = cVar5;
    do {
      __nmemb = (__nmemb - (-1 < cVar3)) + 2;
      cVar3 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar3 != '\0');
    pcVar1 = (char *)calloc(__nmemb,1);
    if (cVar5 != '\0') {
      pcVar4 = source + 1;
      s = pcVar1;
      do {
        sVar2 = encodeUTF8(s,(int)cVar5);
        s = s + sVar2;
        cVar5 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar5 != '\0');
    }
    return pcVar1;
  }
  pcVar1 = (char *)calloc(1,1);
  return pcVar1;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += encodeUTF8(tp, *sp);

    return target;
}